

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O1

size_t webrtc::ReadInt16FromFileToDoubleBuffer(FileWrapper *file,size_t length,double *buffer)

{
  int iVar1;
  int16_t *buffer_00;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  
  if (file == (FileWrapper *)0x0) {
    sVar2 = 0;
  }
  else {
    iVar1 = (*(file->super_InStream)._vptr_InStream[4])();
    sVar2 = 0;
    if (((length != 0) && (buffer != (double *)0x0)) && ((char)iVar1 != '\0')) {
      uVar4 = 0xffffffffffffffff;
      if (-1 < (long)length) {
        uVar4 = length * 2;
      }
      buffer_00 = (int16_t *)operator_new__(uVar4);
      sVar2 = ReadInt16BufferFromFile(file,length,buffer_00);
      if (sVar2 != 0) {
        sVar3 = 0;
        do {
          buffer[sVar3] = (double)(int)buffer_00[sVar3];
          sVar3 = sVar3 + 1;
        } while (sVar2 != sVar3);
      }
      operator_delete__(buffer_00);
    }
  }
  return sVar2;
}

Assistant:

size_t ReadInt16FromFileToDoubleBuffer(FileWrapper* file,
                                       size_t length,
                                       double* buffer) {
  if (!file || !file->Open() || !buffer || length <= 0) {
    return 0;
  }

  std::unique_ptr<int16_t[]> buffer16(new int16_t[length]);

  size_t int16s_read = ReadInt16BufferFromFile(file, length, buffer16.get());

  for (size_t i = 0; i < int16s_read; ++i) {
    buffer[i] = buffer16[i];
  }

  return int16s_read;
}